

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<double,_void>::load
          (type_caster<double,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  long lVar4;
  PyObject *ptr;
  double dVar5;
  handle local_48;
  handle local_40;
  object tmp;
  bool type_error;
  py_type py_value;
  bool convert_local;
  type_caster<double,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<double,_void> *)src.m_ptr;
  bVar1 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    if (!convert) {
      ppPVar3 = handle::ptr((handle *)&this_local);
      iVar2 = _PyObject_TypeCheck(*ppPVar3,(PyTypeObject *)&PyFloat_Type);
      if (iVar2 == 0) {
        src_local.m_ptr._7_1_ = 0;
        goto LAB_0070e5bc;
      }
    }
    ppPVar3 = handle::ptr((handle *)&this_local);
    dVar5 = (double)PyFloat_AsDouble(*ppPVar3);
    if ((dVar5 == -1.0) && (!NAN(dVar5))) {
      lVar4 = PyErr_Occurred();
      if (lVar4 != 0) {
        iVar2 = PyErr_ExceptionMatches(_PyExc_TypeError);
        tmp.super_handle.m_ptr._7_1_ = iVar2 != 0;
        PyErr_Clear();
        if (((tmp.super_handle.m_ptr._7_1_ & 1) != 0) && (convert)) {
          ppPVar3 = handle::ptr((handle *)&this_local);
          iVar2 = PyNumber_Check(*ppPVar3);
          if (iVar2 != 0) {
            ppPVar3 = handle::ptr((handle *)&this_local);
            ptr = (PyObject *)PyNumber_Float(*ppPVar3);
            handle::handle(&local_48,ptr);
            reinterpret_borrow<pybind11::object>((pybind11 *)&local_40,local_48);
            PyErr_Clear();
            src_local.m_ptr._7_1_ = load(this,local_40,false);
            pybind11::object::~object((object *)&local_40);
            goto LAB_0070e5bc;
          }
        }
        src_local.m_ptr._7_1_ = 0;
        goto LAB_0070e5bc;
      }
    }
    this->value = dVar5;
    src_local.m_ptr._7_1_ = 1;
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
LAB_0070e5bc:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        py_type py_value;

        if (!src)
            return false;

        if (std::is_floating_point<T>::value) {
            if (convert || PyFloat_Check(src.ptr()))
                py_value = (py_type) PyFloat_AsDouble(src.ptr());
            else
                return false;
        } else if (sizeof(T) <= sizeof(long)) {
            if (PyFloat_Check(src.ptr()))
                return false;
            if (std::is_signed<T>::value)
                py_value = (py_type) PyLong_AsLong(src.ptr());
            else
                py_value = (py_type) PyLong_AsUnsignedLong(src.ptr());
        } else {
            if (PyFloat_Check(src.ptr()))
                return false;
            if (std::is_signed<T>::value)
                py_value = (py_type) PYBIND11_LONG_AS_LONGLONG(src.ptr());
            else
                py_value = (py_type) PYBIND11_LONG_AS_UNSIGNED_LONGLONG(src.ptr());
        }

        if ((py_value == (py_type) -1 && PyErr_Occurred()) ||
            (std::is_integral<T>::value && sizeof(py_type) != sizeof(T) &&
               (py_value < (py_type) std::numeric_limits<T>::min() ||
                py_value > (py_type) std::numeric_limits<T>::max()))) {
#if PY_VERSION_HEX < 0x03000000
            bool type_error = PyErr_ExceptionMatches(PyExc_SystemError);
#else
            bool type_error = PyErr_ExceptionMatches(PyExc_TypeError);
#endif
            PyErr_Clear();
            if (type_error && convert && PyNumber_Check(src.ptr())) {
                auto tmp = reinterpret_borrow<object>(std::is_floating_point<T>::value
                                                      ? PyNumber_Float(src.ptr())
                                                      : PyNumber_Long(src.ptr()));
                PyErr_Clear();
                return load(tmp, false);
            }
            return false;
        }

        value = (T) py_value;
        return true;
    }